

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg4.c
# Opt level: O2

int32_t borg_power_home(void)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ushort uVar11;
  int iVar12;
  int iVar13;
  ushort uVar14;
  int iVar15;
  short sVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  
  if (num_LIGHT == 1) {
    iVar2 = 0x96;
  }
  else if (num_LIGHT == 2) {
    iVar2 = 0xaa;
  }
  else {
    iVar2 = 0;
    if (2 < num_LIGHT) {
      iVar2 = (uint)(ushort)(num_LIGHT - 2U) + (uint)(ushort)(num_LIGHT - 2U) * 4 + 0xaa;
    }
  }
  if (num_slow_digest == 2) {
    iVar2 = iVar2 + 0x46;
  }
  else if (num_slow_digest == 1) {
    iVar2 = iVar2 + 0x32;
  }
  else if (2 < num_slow_digest) {
    iVar2 = iVar2 + (uint)(ushort)(num_slow_digest - 2U) + (uint)(ushort)(num_slow_digest - 2U) * 4
            + 0x46;
  }
  if (num_regenerate == 2) {
    iVar2 = iVar2 + 100;
  }
  else if (num_regenerate == 1) {
    iVar2 = iVar2 + 0x4b;
  }
  else if (2 < num_regenerate) {
    iVar2 = iVar2 + (uint)(ushort)(num_regenerate - 2) * 10 + 100;
  }
  if (num_telepathy == 2) {
    iVar2 = iVar2 + 0x5dc;
  }
  else if (num_telepathy == 1) {
    iVar2 = iVar2 + 1000;
  }
  else if (2 < num_telepathy) {
    iVar2 = iVar2 + (uint)(ushort)(num_telepathy - 2) * 10 + 0x5dc;
  }
  if (num_see_inv == 2) {
    iVar2 = iVar2 + 0x4b0;
  }
  else if (num_see_inv == 1) {
    iVar2 = iVar2 + 800;
  }
  else if (2 < num_see_inv) {
    iVar2 = iVar2 + (uint)(ushort)(num_see_inv - 2) * 10 + 0x4b0;
  }
  if (num_ffall == 2) {
    iVar2 = iVar2 + 0xf;
  }
  else if (num_ffall == 1) {
    iVar2 = iVar2 + 10;
  }
  else if (2 < num_ffall) {
    iVar2 = iVar2 + (uint)(ushort)num_ffall + 0xd;
  }
  if (num_free_act == 2) {
    iVar2 = iVar2 + 0x5dc;
  }
  else if (num_free_act == 1) {
    iVar2 = iVar2 + 1000;
  }
  else if (2 < num_free_act) {
    iVar2 = iVar2 + (uint)(ushort)(num_free_act - 2) * 10 + 0x5dc;
  }
  if (num_hold_life == 2) {
    iVar2 = iVar2 + 0x5dc;
  }
  else if (num_hold_life == 1) {
    iVar2 = iVar2 + 1000;
  }
  else if (2 < num_hold_life) {
    iVar2 = iVar2 + (uint)(ushort)(num_hold_life - 2) * 10 + 0x5dc;
  }
  if (num_resist_acid == 2) {
    iVar2 = iVar2 + 0x5dc;
  }
  else if (num_resist_acid == 1) {
    iVar2 = iVar2 + 1000;
  }
  else if (2 < num_resist_acid) {
    iVar2 = iVar2 + (uint)(ushort)num_resist_acid + 0x5da;
  }
  if (num_immune_acid == 2) {
    iVar2 = iVar2 + 5000;
  }
  else if (num_immune_acid == 1) {
    iVar2 = iVar2 + 3000;
  }
  else if (2 < num_immune_acid) {
    iVar2 = iVar2 + (uint)(ushort)(num_immune_acid - 2) * 0x1e + 5000;
  }
  if (num_resist_elec == 2) {
    iVar2 = iVar2 + 0x5dc;
  }
  else if (num_resist_elec == 1) {
    iVar2 = iVar2 + 1000;
  }
  else if (2 < num_resist_elec) {
    iVar2 = iVar2 + (uint)(ushort)num_resist_elec + 0x5da;
  }
  if (num_immune_elec == 2) {
    iVar2 = iVar2 + 5000;
  }
  else if (num_immune_elec == 1) {
    iVar2 = iVar2 + 3000;
  }
  else if (2 < num_immune_elec) {
    iVar2 = iVar2 + (uint)(ushort)(num_immune_elec - 2) * 0x1e + 5000;
  }
  if (num_resist_fire == 2) {
    iVar2 = iVar2 + 0x5dc;
  }
  else if (num_resist_fire == 1) {
    iVar2 = iVar2 + 1000;
  }
  else if (2 < num_resist_fire) {
    iVar2 = iVar2 + (uint)(ushort)num_resist_fire + 0x5da;
  }
  if (num_immune_fire == 2) {
    iVar2 = iVar2 + 5000;
  }
  else if (num_immune_fire == 1) {
    iVar2 = iVar2 + 3000;
  }
  else if (2 < num_immune_fire) {
    iVar2 = iVar2 + (uint)(ushort)(num_immune_fire - 2) * 0x1e + 5000;
  }
  if (num_resist_cold == 2) {
    iVar2 = iVar2 + 0x5dc;
  }
  else if (num_resist_cold == 1) {
    iVar2 = iVar2 + 1000;
  }
  else if (2 < num_resist_cold) {
    iVar2 = iVar2 + (uint)(ushort)num_resist_cold + 0x5da;
  }
  if (num_immune_cold == 2) {
    iVar2 = iVar2 + 5000;
  }
  else if (num_immune_cold == 1) {
    iVar2 = iVar2 + 3000;
  }
  else if (2 < num_immune_cold) {
    iVar2 = iVar2 + (uint)(ushort)(num_immune_cold - 2) * 0x1e + 5000;
  }
  if (num_resist_pois == 2) {
    iVar2 = iVar2 + 9000;
  }
  else if (num_resist_pois == 1) {
    iVar2 = iVar2 + 5000;
  }
  else if (2 < num_resist_pois) {
    iVar2 = iVar2 + (uint)(ushort)(num_resist_pois - 2) * 0x28 + 9000;
  }
  if (num_resist_conf == 2) {
    iVar2 = iVar2 + 8000;
  }
  else if (num_resist_conf == 1) {
    iVar2 = iVar2 + 2000;
  }
  else if (2 < num_resist_conf) {
    iVar2 = iVar2 + (uint)(ushort)(num_resist_conf - 2) * 0x2d + 8000;
  }
  if (num_resist_sound == 2) {
    iVar2 = iVar2 + 700;
  }
  else if (num_resist_sound == 1) {
    iVar2 = iVar2 + 500;
  }
  else if (2 < num_resist_sound) {
    iVar2 = iVar2 + (uint)(ushort)(num_resist_sound - 2) * 0x1e + 700;
  }
  if (num_resist_LIGHT == 2) {
    iVar2 = iVar2 + 0x96;
  }
  else if (num_resist_LIGHT == 1) {
    iVar2 = iVar2 + 100;
  }
  else if (2 < num_resist_LIGHT) {
    iVar2 = iVar2 + (uint)(ushort)num_resist_LIGHT + 0x94;
  }
  if (num_resist_dark == 2) {
    iVar2 = iVar2 + 0x96;
  }
  else if (num_resist_dark == 1) {
    iVar2 = iVar2 + 100;
  }
  else if (2 < num_resist_dark) {
    iVar2 = iVar2 + (uint)(ushort)num_resist_dark + 0x94;
  }
  if (num_resist_chaos == 2) {
    iVar2 = iVar2 + 0x5dc;
  }
  else if (num_resist_chaos == 1) {
    iVar2 = iVar2 + 1000;
  }
  else if (2 < num_resist_chaos) {
    iVar2 = iVar2 + (uint)(ushort)(num_resist_chaos - 2) * 10 + 0x5dc;
  }
  if (num_resist_disen == 2) {
    iVar2 = iVar2 + 7000;
  }
  else if (num_resist_disen == 1) {
    iVar2 = iVar2 + 5000;
  }
  else if (2 < num_resist_disen) {
    iVar2 = iVar2 + (uint)(ushort)(num_resist_disen - 2) * 0x23 + 7000;
  }
  if (num_resist_shard == 2) {
    iVar2 = iVar2 + 0x96;
  }
  else if (num_resist_shard == 1) {
    iVar2 = iVar2 + 100;
  }
  else if (2 < num_resist_shard) {
    iVar2 = iVar2 + (uint)(ushort)num_resist_shard + 0x94;
  }
  if (num_resist_nexus == 2) {
    iVar2 = iVar2 + 300;
  }
  else if (num_resist_nexus == 1) {
    iVar2 = iVar2 + 200;
  }
  else if (2 < num_resist_nexus) {
    iVar2 = iVar2 + (uint)(ushort)(num_resist_nexus - 2) * 2 + 300;
  }
  if (num_resist_blind == 2) {
    iVar2 = iVar2 + 1000;
  }
  else if (num_resist_blind == 1) {
    iVar2 = iVar2 + 500;
  }
  else if (2 < num_resist_blind) {
    iVar2 = iVar2 + (uint)(ushort)(num_resist_blind - 2U) +
                    (uint)(ushort)(num_resist_blind - 2U) * 4 + 1000;
  }
  if (num_resist_neth == 2) {
    iVar2 = iVar2 + 4000;
  }
  else if (num_resist_neth == 1) {
    iVar2 = iVar2 + 3000;
  }
  else if (2 < num_resist_neth) {
    iVar2 = iVar2 + (uint)(ushort)(num_resist_neth - 2) * 0x2d + 4000;
  }
  iVar5 = (int)home_stat_add[0];
  if (iVar5 < 9) {
    iVar2 = iVar5 * 300 + iVar2;
  }
  else if ((ushort)home_stat_add[0] < 0xf) {
    iVar2 = (iVar5 - 9U & 0xffff) * 200 + iVar2 + 0xa8c;
  }
  else {
    iVar2 = (uint)(ushort)home_stat_add[0] + iVar2 + 0xf2d;
  }
  iVar5 = (int)home_stat_add[3];
  if (iVar5 < 9) {
    iVar2 = iVar5 * 300 + iVar2;
  }
  else if ((ushort)home_stat_add[3] < 0xf) {
    iVar2 = (iVar5 - 9U & 0xffff) * 200 + iVar2 + 0xa8c;
  }
  else {
    iVar2 = (uint)(ushort)home_stat_add[3] + iVar2 + 0xf2d;
  }
  iVar5 = (int)home_stat_add[4];
  if (iVar5 < 0xf) {
    iVar2 = iVar5 * 300 + iVar2;
  }
  else if ((ushort)home_stat_add[4] < 0x15) {
    iVar2 = iVar2 + (iVar5 - 0xfU & 0xffff) * 200 + 0x1194;
  }
  else {
    iVar2 = (uint)(ushort)home_stat_add[4] + iVar2 + 0x162f;
  }
  wVar3 = borg_spell_stat();
  if (L'\xffffffff' < wVar3) {
    iVar5 = (int)home_stat_add[(uint)wVar3];
    if (iVar5 < 0x14) {
      iVar2 = iVar2 + iVar5 * 400;
    }
    else if ((ushort)home_stat_add[(uint)wVar3] < 0x1a) {
      iVar2 = iVar2 + iVar5 * 300 + 2000;
    }
    else {
      iVar2 = iVar2 + iVar5 * 5 + 0xe56;
    }
  }
  if (num_sustain_str == 2) {
    iVar2 = iVar2 + 0xfa;
  }
  else if (num_sustain_str == 1) {
    iVar2 = iVar2 + 200;
  }
  else if (2 < num_sustain_str) {
    iVar2 = iVar2 + (uint)(ushort)num_sustain_str + 0xf8;
  }
  if (num_sustain_int == 2) {
    iVar2 = iVar2 + 0xfa;
  }
  else if (num_sustain_int == 1) {
    iVar2 = iVar2 + 200;
  }
  else if (2 < num_sustain_int) {
    iVar2 = iVar2 + (uint)(ushort)num_sustain_int + 0xf8;
  }
  if (num_sustain_wis == 2) {
    iVar2 = iVar2 + 0xfa;
  }
  else if (num_sustain_wis == 1) {
    iVar2 = iVar2 + 200;
  }
  else if (2 < num_sustain_wis) {
    iVar2 = iVar2 + (uint)(ushort)num_sustain_wis + 0xf8;
  }
  if (num_sustain_con == 2) {
    iVar2 = iVar2 + 0xfa;
  }
  else if (num_sustain_con == 1) {
    iVar2 = iVar2 + 200;
  }
  else if (2 < num_sustain_con) {
    iVar2 = iVar2 + (uint)(ushort)num_sustain_con + 0xf8;
  }
  if (num_sustain_dex == 2) {
    iVar2 = iVar2 + 0xfa;
  }
  else if (num_sustain_dex == 1) {
    iVar2 = iVar2 + 200;
  }
  else if (2 < num_sustain_dex) {
    iVar2 = iVar2 + (uint)(ushort)num_sustain_dex + 0xf8;
  }
  if (num_sustain_all == 2) {
    iVar2 = iVar2 + 0x5dc;
  }
  else if (num_sustain_all == 1) {
    iVar2 = iVar2 + 1000;
  }
  else if (2 < num_sustain_all) {
    iVar2 = iVar2 + (uint)(ushort)num_sustain_all + 0x5da;
  }
  iVar5 = (int)num_weapons;
  if (iVar5 < 6) {
    if (1 < num_weapons) {
      iVar2 = iVar2 + iVar5 * -100 + 100;
    }
  }
  else {
    iVar2 = iVar2 + iVar5 * -2000 + 10000;
  }
  iVar5 = 0;
  if (2 < num_bow) {
    iVar5 = num_bow * -1000 + 2000;
  }
  iVar5 = iVar5 + iVar2;
  iVar2 = (int)num_rings;
  if (iVar2 < 7) {
    if (4 < num_rings) {
      iVar5 = iVar5 + iVar2 * -2000 + 8000;
    }
  }
  else {
    iVar5 = iVar5 + iVar2 * -4000 + 24000;
  }
  iVar2 = borg_skill[0x18];
  iVar6 = 0;
  if (iVar2 < 10) {
    iVar6 = (int)num_food;
    if (kb_info[0x1c].max_stack < (int)num_food) {
      iVar6 = kb_info[0x1c].max_stack;
    }
    iVar15 = 0;
    if (0 < iVar6) {
      iVar15 = iVar6;
    }
    iVar6 = iVar15 * 8000 + ((uint)((iVar15 + -1) * iVar15) >> 1) * -10;
  }
  uVar18 = kb_info[0x19].max_stack;
  uVar8 = (int)num_ident;
  if ((int)uVar18 < (int)num_ident) {
    uVar8 = uVar18;
  }
  uVar17 = 0;
  if (0 < (int)uVar8) {
    uVar17 = uVar8;
  }
  iVar15 = ((uVar17 - 1) * uVar17 >> 1) * -10 + uVar17 * 2000 + iVar6;
  iVar6 = borg_skill[0x17];
  if (iVar6 < 0x2d) {
    uVar8 = (int)num_enchant_to_a;
    if ((int)uVar18 < (int)num_enchant_to_a) {
      uVar8 = uVar18;
    }
    uVar17 = 0;
    if ((int)uVar8 < 1) {
      uVar8 = uVar17;
    }
    uVar7 = (int)num_enchant_to_h;
    if ((int)uVar18 < (int)num_enchant_to_h) {
      uVar7 = uVar18;
    }
    if ((int)uVar7 < 1) {
      uVar7 = uVar17;
    }
    uVar20 = (int)num_enchant_to_d;
    if ((int)uVar18 < (int)num_enchant_to_d) {
      uVar20 = uVar18;
    }
    if ((int)uVar20 < 1) {
      uVar20 = uVar17;
    }
    iVar15 = iVar15 + (uVar7 + uVar8 + uVar20) * 500 +
             (((uVar7 - 1) * uVar7 >> 1) + ((uVar8 - 1) * uVar8 >> 1) + ((uVar20 - 1) * uVar20 >> 1)
             ) * -10;
  }
  uVar8 = (int)num_pfe;
  if ((int)uVar18 < (int)num_pfe) {
    uVar8 = uVar18;
  }
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  uVar17 = (int)num_glyph;
  if ((int)uVar18 < (int)num_glyph) {
    uVar17 = uVar18;
  }
  if ((int)uVar17 < 1) {
    uVar17 = 0;
  }
  iVar12 = uVar18 * 2;
  iVar10 = (int)num_genocide;
  if (iVar12 < num_genocide) {
    iVar10 = iVar12;
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  iVar13 = (int)num_mass_genocide;
  if (iVar12 < num_mass_genocide) {
    iVar13 = iVar12;
  }
  if (iVar13 < 1) {
    iVar13 = 0;
  }
  uVar7 = (int)num_recharge;
  if ((int)uVar18 < (int)num_recharge) {
    uVar7 = uVar18;
  }
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  iVar15 = uVar17 * 500 + uVar8 * 500 + iVar10 * 500 + iVar13 * 500 + uVar7 * 500 + iVar15;
  if ((borg_class == L'\0') && (borg_skill[0x5f] - 0x15U < 0x3b)) {
    uVar20 = kb_info[0x1a].max_stack;
    uVar21 = (int)num_pot_rheat;
    if ((int)uVar20 < (int)num_pot_rheat) {
      uVar21 = uVar20;
    }
    uVar4 = 0;
    if (0 < (int)uVar21) {
      uVar4 = uVar21;
    }
    uVar21 = (int)num_pot_rcold;
    if ((int)uVar20 < (int)num_pot_rcold) {
      uVar21 = uVar20;
    }
    if ((int)uVar21 < (int)uVar4) {
      uVar21 = uVar4;
    }
    iVar15 = iVar15 + (uVar4 * -10 + 100) * (uVar21 - uVar4) + uVar4 * 100 +
             (((~uVar4 + uVar21) * (uVar21 - uVar4) >> 1) + ((uVar4 - 1) * uVar4 >> 1)) * -10;
  }
  sVar16 = 0;
  if (0 < num_recall) {
    sVar16 = num_recall;
  }
  if (4 < sVar16) {
    sVar16 = 5;
  }
  iVar15 = (uint)(ushort)(sVar16 * 100) + iVar15 +
           (((uVar17 - 1) * uVar17 >> 1) + ((uVar8 - 1) * uVar8 >> 1) +
            ((uint)((iVar10 + -1) * iVar10) >> 1) + ((uVar7 - 1) * uVar7 >> 1)) * -10;
  if (iVar2 < 0x28) {
    uVar14 = 0;
    if (0 < num_escape) {
      uVar14 = num_escape;
    }
    if (0x54 < (short)uVar14) {
      uVar14 = 0x55;
    }
    uVar8 = (uint)uVar14;
    iVar15 = iVar15 + ((uVar8 - 1) * uVar8 >> 1) * -10 + uVar8 * 2000;
  }
  iVar10 = (int)num_tele_staves;
  if (kb_info[0x16].max_stack < (int)num_tele_staves) {
    iVar10 = kb_info[0x16].max_stack;
  }
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  uVar8 = (uint)(ushort)num_teleport;
  if (num_teleport < 1) {
    uVar8 = 0;
  }
  uVar14 = 0x55;
  if ((short)(ushort)uVar8 < 0x55) {
    uVar14 = (ushort)uVar8;
  }
  iVar15 = (uint)uVar14 * 5000 + iVar15;
  if (iVar2 < 10) {
    uVar8 = (int)num_phase;
    if ((int)uVar18 < (int)num_phase) {
      uVar8 = uVar18;
    }
    uVar18 = 0;
    if (0 < (int)uVar8) {
      uVar18 = uVar8;
    }
    iVar15 = iVar15 + uVar18 * 5000;
  }
  iVar15 = iVar15 + iVar10 * -50000;
  if (1 < borg_skill[0x13]) {
    iVar2 = (int)num_mana;
    if (kb_info[0x1a].max_stack < (int)num_mana) {
      iVar2 = kb_info[0x1a].max_stack;
    }
    iVar10 = 0;
    if (0 < iVar2) {
      iVar10 = iVar2;
    }
    iVar15 = iVar10 * 6000 + iVar15 + ((iVar10 + -1) * iVar10 & 0x3ffffffeU) * -4;
  }
  uVar8 = 0;
  uVar18 = (uint)(ushort)num_heal;
  if (num_heal < 1) {
    uVar18 = uVar8;
  }
  if (iVar6 == 1) {
    uVar17 = 10;
    if (uVar18 < 10) {
      uVar17 = uVar18;
    }
    iVar15 = iVar15 + uVar17 * -5000;
  }
  uVar17 = (int)num_cure_critical;
  if (kb_info[0x1a].max_stack < (int)num_cure_critical) {
    uVar17 = kb_info[0x1a].max_stack;
  }
  if ((int)uVar17 < 1) {
    uVar17 = uVar8;
  }
  if (0x59 < uVar18) {
    uVar18 = 0x5a;
  }
  uVar7 = (uint)(ushort)num_ezheal;
  if (num_ezheal < 1) {
    uVar7 = uVar8;
  }
  if (0xc5 < (short)uVar7) {
    uVar7 = 0xc6;
  }
  if (0 < num_life) {
    uVar8 = (uint)(ushort)num_life;
  }
  if (0xc5 < (short)uVar8) {
    uVar8 = 0xc6;
  }
  iVar15 = uVar7 * 8000 + uVar18 * 3000 + uVar17 * 0x5dc + uVar8 * 9000 +
           ((uVar17 - 1) * uVar17 >> 1) * -10 + iVar15;
  if (0x23 < iVar6) {
    uVar14 = 0;
    if (0 < num_cure_serious) {
      uVar14 = num_cure_serious;
    }
    uVar11 = 0x5a;
    if ((short)uVar14 < 0x5a) {
      uVar11 = uVar14;
    }
    uVar18 = (uint)uVar11;
    iVar15 = iVar15 + uVar18 * -0x5dc + ((uVar18 - 1) * uVar18 >> 1) * 10;
  }
  iVar2 = iVar15 + -0x1d4c;
  if (num_fix_exp == 0) {
    iVar2 = iVar15;
  }
  if (iVar6 != 0x32) {
    iVar2 = iVar15;
  }
  if (iVar6 - 0x24U < 0xe) {
    uVar14 = 0;
    if (0 < num_fix_exp) {
      uVar14 = num_fix_exp;
    }
    uVar11 = 0x46;
    if ((short)uVar14 < 0x46) {
      uVar11 = uVar14;
    }
  }
  else {
    if (0x23 < iVar6) goto LAB_001fcc97;
    uVar14 = 0;
    if (0 < num_fix_exp) {
      uVar14 = num_fix_exp;
    }
    uVar11 = 5;
    if ((short)uVar14 < 5) {
      uVar11 = uVar14;
    }
  }
  uVar18 = (uint)uVar11;
  iVar2 = ((uVar18 - 1) * uVar18 >> 1) * -10 + uVar18 * 1000 + iVar2;
LAB_001fcc97:
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    iVar15 = iVar2;
    if (iVar6 < 0xf) {
      iVar12 = iVar2 + 0x6144;
      iVar10 = 5000;
      for (iVar13 = 0; (iVar15 = iVar12, iVar13 != 5 && (iVar15 = iVar2, iVar13 < num_book[lVar9]));
          iVar13 = iVar13 + 1) {
        iVar2 = iVar2 + iVar10;
        iVar10 = iVar10 + -10;
      }
    }
    iVar2 = iVar15;
  }
  iVar2 = num_ego * 5000 + num_artifact * 500 + iVar2;
  if (home_un_id != 0) {
    iVar2 = iVar2 + ((int)home_un_id - borg_skill[0xc2]) * 0x3ed;
  }
  iVar15 = (uint)(ushort)num_neck * -0x5dc + 0x1194;
  iVar6 = 0;
  if (num_neck < 4) {
    iVar15 = 0;
  }
  iVar10 = (uint)(ushort)num_armor * -1000 + 6000;
  if (num_armor < 7) {
    iVar10 = iVar6;
  }
  iVar12 = (uint)(ushort)num_cloaks * -1000 + 3000;
  if (num_cloaks < 4) {
    iVar12 = 0;
  }
  iVar13 = (uint)(ushort)num_shields * -1000 + 3000;
  if (num_shields < 4) {
    iVar13 = iVar6;
  }
  iVar19 = (uint)(ushort)num_hats * -1000 + 4000;
  if (num_hats < 5) {
    iVar19 = 0;
  }
  iVar1 = (uint)(ushort)num_gloves * -1000 + 3000;
  if (num_gloves < 4) {
    iVar1 = iVar6;
  }
  iVar6 = (uint)(ushort)num_boots * -1000 + 3000;
  if (num_boots < 4) {
    iVar6 = 0;
  }
  return ((int)num_bad_gloves + (int)num_edged_weapon) * -3000 +
         num_duplicate_items * -50000 + iVar6 + iVar1 +
         iVar19 + iVar13 + iVar12 + iVar10 + iVar15 + iVar5 + (int)home_damage + iVar2;
}

Assistant:

static int32_t borg_power_home_aux1(void)
{
    int32_t value = 0L;

    /* This would be better seperated by item type (so 1 bonus for resist cold
     * armor */
    /*   1 bonus for resist cold shield... but that would take a bunch more
     * code. */

    /* try to collect at least 2 of each resist/power (for swapping) */
    /* This can be used to get rid of extra artifacts... */

    /* spare lite sources.  Artifacts only */
    if (num_LIGHT == 1)
        value += 150L;
    else if (num_LIGHT == 2)
        value += 170L;
    else if (num_LIGHT > 2)
        value += 170L + (num_LIGHT - 2) * 5L;

    if (num_slow_digest == 1)
        value += 50L;
    else if (num_slow_digest == 2)
        value += 70L;
    else if (num_slow_digest > 2)
        value += 70L + (num_slow_digest - 2) * 5L;

    if (num_regenerate == 1)
        value += 75L;
    else if (num_regenerate == 2)
        value += 100L;
    else if (num_regenerate > 2)
        value += 100L + (num_regenerate - 2) * 10L;

    if (num_telepathy == 1)
        value += 1000L;
    else if (num_telepathy == 2)
        value += 1500L;
    else if (num_telepathy > 2)
        value += 1500L + (num_telepathy - 2) * 10L;

    if (num_see_inv == 1)
        value += 800L;
    else if (num_see_inv == 2)
        value += 1200L;
    else if (num_see_inv > 2)
        value += 1200L + (num_see_inv - 2) * 10L;

    if (num_ffall == 1)
        value += 10L;
    else if (num_ffall == 2)
        value += 15L;
    else if (num_ffall > 2)
        value += 15L + (num_ffall - 2) * 1L;

    if (num_free_act == 1)
        value += 1000L;
    else if (num_free_act == 2)
        value += 1500L;
    else if (num_free_act > 2)
        value += 1500L + (num_free_act - 2) * 10L;

    if (num_hold_life == 1)
        value += 1000L;
    else if (num_hold_life == 2)
        value += 1500L;
    else if (num_hold_life > 2)
        value += 1500L + (num_hold_life - 2) * 10L;

    if (num_resist_acid == 1)
        value += 1000L;
    else if (num_resist_acid == 2)
        value += 1500L;
    else if (num_resist_acid > 2)
        value += 1500L + (num_resist_acid - 2) * 1L;
    if (num_immune_acid == 1)
        value += 3000L;
    else if (num_immune_acid == 2)
        value += 5000L;
    else if (num_immune_acid > 2)
        value += 5000L + (num_immune_acid - 2) * 30L;

    if (num_resist_elec == 1)
        value += 1000L;
    else if (num_resist_elec == 2)
        value += 1500L;
    else if (num_resist_elec > 2)
        value += 1500L + (num_resist_elec - 2) * 1L;
    if (num_immune_elec == 1)
        value += 3000L;
    else if (num_immune_elec == 2)
        value += 5000L;
    else if (num_immune_elec > 2)
        value += 5000L + (num_immune_elec - 2) * 30L;

    if (num_resist_fire == 1)
        value += 1000L;
    else if (num_resist_fire == 2)
        value += 1500L;
    else if (num_resist_fire > 2)
        value += 1500L + (num_resist_fire - 2) * 1L;
    if (num_immune_fire == 1)
        value += 3000L;
    else if (num_immune_fire == 2)
        value += 5000L;
    else if (num_immune_fire > 2)
        value += 5000L + (num_immune_fire - 2) * 30L;

    if (num_resist_cold == 1)
        value += 1000L;
    else if (num_resist_cold == 2)
        value += 1500L;
    else if (num_resist_cold > 2)
        value += 1500L + (num_resist_cold - 2) * 1L;
    if (num_immune_cold == 1)
        value += 3000L;
    else if (num_immune_cold == 2)
        value += 5000L;
    else if (num_immune_cold > 2)
        value += 5000L + (num_immune_cold - 2) * 30L;

    if (num_resist_pois == 1)
        value += 5000L;
    else if (num_resist_pois == 2)
        value += 9000L;
    else if (num_resist_pois > 2)
        value += 9000L + (num_resist_pois - 2) * 40L;

    if (num_resist_conf == 1)
        value += 2000L;
    else if (num_resist_conf == 2)
        value += 8000L;
    else if (num_resist_conf > 2)
        value += 8000L + (num_resist_conf - 2) * 45L;

    if (num_resist_sound == 1)
        value += 500L;
    else if (num_resist_sound == 2)
        value += 700L;
    else if (num_resist_sound > 2)
        value += 700L + (num_resist_sound - 2) * 30L;

    if (num_resist_LIGHT == 1)
        value += 100L;
    else if (num_resist_LIGHT == 2)
        value += 150L;
    else if (num_resist_LIGHT > 2)
        value += 150L + (num_resist_LIGHT - 2) * 1L;

    if (num_resist_dark == 1)
        value += 100L;
    else if (num_resist_dark == 2)
        value += 150L;
    else if (num_resist_dark > 2)
        value += 150L + (num_resist_dark - 2) * 1L;

    if (num_resist_chaos == 1)
        value += 1000L;
    else if (num_resist_chaos == 2)
        value += 1500L;
    else if (num_resist_chaos > 2)
        value += 1500L + (num_resist_chaos - 2) * 10L;

    if (num_resist_disen == 1)
        value += 5000L;
    else if (num_resist_disen == 2)
        value += 7000L;
    else if (num_resist_disen > 2)
        value += 7000L + (num_resist_disen - 2) * 35L;

    if (num_resist_shard == 1)
        value += 100L;
    else if (num_resist_shard == 2)
        value += 150L;
    else if (num_resist_shard > 2)
        value += 150L + (num_resist_shard - 2) * 1L;

    if (num_resist_nexus == 1)
        value += 200L;
    else if (num_resist_nexus == 2)
        value += 300L;
    else if (num_resist_nexus > 2)
        value += 300L + (num_resist_nexus - 2) * 2L;

    if (num_resist_blind == 1)
        value += 500L;
    else if (num_resist_blind == 2)
        value += 1000L;
    else if (num_resist_blind > 2)
        value += 1000L + (num_resist_blind - 2) * 5L;

    if (num_resist_neth == 1)
        value += 3000L;
    else if (num_resist_neth == 2)
        value += 4000L;
    else if (num_resist_neth > 2)
        value += 4000L + (num_resist_neth - 2) * 45L;

    /* stat gain items as well...(good to carry ring of dex +6 in */
    /*                            house even if I don't need it right now) */
    if (home_stat_add[STAT_STR] < 9)
        value += home_stat_add[STAT_STR] * 300L;
    else if (home_stat_add[STAT_STR] < 15)
        value += 9 * 300L + (home_stat_add[STAT_STR] - 9) * 200L;
    else
        value += 9 * 300L + 6 * 200L + (home_stat_add[STAT_STR] - 15) * 1L;

    if (home_stat_add[STAT_DEX] < 9)
        value += home_stat_add[STAT_DEX] * 300L;
    else if (home_stat_add[STAT_DEX] < 15)
        value += 9 * 300L + (home_stat_add[STAT_DEX] - 9) * 200L;
    else
        value += 9 * 300L + 6 * 200L + (home_stat_add[STAT_DEX] - 15) * 1L;

    /* HACK extra con for thorin and other such things */
    if (home_stat_add[STAT_CON] < 15)
        value += home_stat_add[STAT_CON] * 300L;
    else if (home_stat_add[STAT_CON] < 21)
        value += 15 * 300L + (home_stat_add[STAT_CON] - 15) * 200L;
    else
        value += 15 * 300L + 6 * 200L + (home_stat_add[STAT_CON] - 21) * 1L;

    /* spell stat is only bonused for spell casters. */
    int spell_stat = borg_spell_stat();
    if (spell_stat >= 0) {
        if (home_stat_add[spell_stat] < 20)
            value += home_stat_add[spell_stat] * 400L;
        else if (home_stat_add[spell_stat] < 26)
            value += 20 * 400L + (home_stat_add[spell_stat] - 20) * 300L;
        else
            value
                += 20 * 100L + 6 * 300L + (home_stat_add[spell_stat] - 26) * 5L;
    }

    /* Sustains */
    if (num_sustain_str == 1)
        value += 200L;
    else if (num_sustain_str == 2)
        value += 250L;
    else if (num_sustain_str > 2)
        value += 250L + (num_sustain_str - 2) * 1L;

    if (num_sustain_int == 1)
        value += 200L;
    else if (num_sustain_int == 2)
        value += 250L;
    else if (num_sustain_int > 2)
        value += 250L + (num_sustain_int - 2) * 1L;

    if (num_sustain_wis == 1)
        value += 200L;
    else if (num_sustain_wis == 2)
        value += 250L;
    else if (num_sustain_wis > 2)
        value += 250L + (num_sustain_wis - 2) * 1L;

    if (num_sustain_con == 1)
        value += 200L;
    else if (num_sustain_con == 2)
        value += 250L;
    else if (num_sustain_con > 2)
        value += 250L + (num_sustain_con - 2) * 1L;

    if (num_sustain_dex == 1)
        value += 200L;
    else if (num_sustain_dex == 2)
        value += 250L;
    else if (num_sustain_dex > 2)
        value += 250L + (num_sustain_dex - 2) * 1L;

    if (num_sustain_all == 1)
        value += 1000L;
    else if (num_sustain_all == 2)
        value += 1500L;
    else if (num_sustain_all > 2)
        value += 1500L + (num_sustain_all - 2) * 1L;

    /* do a minus for too many duplicates.  This way we do not store */
    /* useless items and spread out types of items. */
    if (num_weapons > 5)
        value -= (num_weapons - 5) * 2000L;
    else if (num_weapons > 1)
        value -= (num_weapons - 1) * 100L;
    if (num_bow > 2)
        value -= (num_bow - 2) * 1000L;
    if (num_rings > 6)
        value -= (num_rings - 6) * 4000L;
    else if (num_rings > 4)
        value -= (num_rings - 4) * 2000L;
    if (num_neck > 3)
        value -= (num_neck - 3) * 1500L;
    else if (num_neck > 3)
        value -= (num_neck - 3) * 700L;
    if (num_armor > 6)
        value -= (num_armor - 6) * 1000L;
    if (num_cloaks > 3)
        value -= (num_cloaks - 3) * 1000L;
    if (num_shields > 3)
        value -= (num_shields - 3) * 1000L;
    if (num_hats > 4)
        value -= (num_hats - 4) * 1000L;
    if (num_gloves > 3)
        value -= (num_gloves - 3) * 1000L;
    if (num_boots > 3)
        value -= (num_boots - 3) * 1000L;

    value += home_damage;

    /* if edged and priest, dump it   */
    value -= num_edged_weapon * 3000L;

    /* if gloves and mage or ranger and not FA/Dex, dump it. */
    value -= num_bad_gloves * 3000L;

    /* do not allow duplication of items. */
    value -= num_duplicate_items * 50000L;

    /* Return the value */
    return (value);
}